

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O2

const_iterator * __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
::const_iterator::operator++(const_iterator *this)

{
  AssertIsFull((this->inner_).ctrl_,'\0',(GenerationType *)0x0,"operator++");
  (this->inner_).ctrl_ = (this->inner_).ctrl_ + 1;
  (this->inner_).field_1.slot_ = (this->inner_).field_1.slot_ + 1;
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
  ::iterator::skip_empty_or_deleted(&this->inner_);
  if (*(this->inner_).ctrl_ == kSentinel) {
    (this->inner_).ctrl_ = (ctrl_t *)0x0;
  }
  return this;
}

Assistant:

const_iterator& operator++() {
      ++inner_;
      return *this;
    }